

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O1

int opensshcert_pubkey_bits(ssh_keyalg *self,ptrlen blob)

{
  int iVar1;
  ptrlen pVar2;
  BinarySource src [1];
  BinarySource local_38;
  
  local_38.len = blob.len;
  local_38.data = blob.ptr;
  local_38.binarysource_ = &local_38;
  local_38.pos = 0;
  local_38.err = BSE_NO_ERROR;
  BinarySource_get_string(&local_38);
  BinarySource_get_string(local_38.binarysource_);
  pVar2.ptr = (void *)((long)(local_38.binarysource_)->data + (local_38.binarysource_)->pos);
  pVar2.len = (local_38.binarysource_)->len - (local_38.binarysource_)->pos;
  iVar1 = (*self->base_alg->pubkey_bits)(self->base_alg,pVar2);
  return iVar1;
}

Assistant:

static int opensshcert_pubkey_bits(const ssh_keyalg *self, ptrlen blob)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, blob);

    get_string(src);                   /* key type */
    get_string(src);                   /* nonce */
    return ssh_key_public_bits(
        self->base_alg, make_ptrlen(get_ptr(src), get_avail(src)));
}